

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_ssl_getsessionid(Curl_cfilter *cf,Curl_easy *data,void **ssl_sessionid,size_t *idsize)

{
  ConnectBits CVar1;
  void *pvVar2;
  connectdata *pcVar3;
  Curl_share *pCVar4;
  Curl_ssl_session *pCVar5;
  char *second;
  connectdata *pcVar6;
  _Bool _Var7;
  int iVar8;
  long *plVar9;
  ssl_primary_config *c2;
  long lVar10;
  ssl_config_data *psVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  
  lVar12 = 0x1c0;
  psVar11 = &(data->set).ssl;
  if (cf->cft == &Curl_cft_ssl_proxy) {
    lVar12 = 0x230;
    psVar11 = &(data->set).proxy_ssl;
  }
  pvVar2 = cf->ctx;
  bVar15 = true;
  pcVar3 = cf->conn;
  *ssl_sessionid = (void *)0x0;
  if ((((psVar11->primary).field_0x69 & 8) != 0) &&
     ((data->state).session != (Curl_ssl_session *)0x0)) {
    pCVar4 = data->share;
    if ((pCVar4 == (Curl_share *)0x0) || ((pCVar4->specifier & 0x10) == 0)) {
      plVar9 = &(data->state).sessionage;
    }
    else {
      plVar9 = &pCVar4->sessionage;
    }
    bVar15 = (data->set).general_ssl.max_ssl_sessions == 0;
    if (!bVar15) {
      lVar10 = 0x38;
      uVar13 = 0;
      do {
        pCVar5 = (data->state).session;
        if ((*(long *)((long)pCVar5 + lVar10 + -0x20) != 0) &&
           (iVar8 = curl_strequal(*(char **)((long)pvVar2 + 8),
                                  *(char **)((long)pCVar5 + lVar10 + -0x38)), iVar8 != 0)) {
          CVar1 = cf->conn->bits;
          if (((uint)CVar1 >> 9 & 1) == 0) {
            if (*(long *)((long)pCVar5 + lVar10 + -0x30) != 0) {
              if (((uint)CVar1 >> 9 & 1) == 0) goto LAB_001283ec;
              goto LAB_0012836e;
            }
          }
          else {
LAB_0012836e:
            second = *(char **)((long)pCVar5 + lVar10 + -0x30);
            if ((second == (char *)0x0) ||
               (iVar8 = curl_strequal((cf->conn->conn_to_host).name,second), iVar8 == 0))
            goto LAB_001283ec;
          }
          pcVar6 = cf->conn;
          if (((uint)pcVar6->bits >> 10 & 1) == 0) {
            if (*(int *)((long)pCVar5 + lVar10 + -4) != -1) {
              if (((uint)pcVar6->bits >> 10 & 1) == 0) goto LAB_001283ec;
              goto LAB_001283a6;
            }
          }
          else {
LAB_001283a6:
            iVar8 = *(int *)((long)pCVar5 + lVar10 + -4);
            if ((iVar8 == -1) || (pcVar6->conn_to_port != iVar8)) goto LAB_001283ec;
          }
          if ((*(int *)((long)pvVar2 + 0x50) == *(int *)((long)pCVar5 + lVar10 + -8)) &&
             ((iVar8 = curl_strequal(pcVar6->handler->scheme,
                                     *(char **)((long)pCVar5 + lVar10 + -0x28)), iVar8 != 0 &&
              (_Var7 = match_ssl_primary_config
                                 ((Curl_easy *)((long)&(pcVar3->bundle_node).ptr + lVar12),
                                  (ssl_primary_config *)((long)&pCVar5->name + lVar10),c2), _Var7)))
             ) {
            lVar12 = *plVar9;
            *plVar9 = lVar12 + 1;
            *(long *)((long)pCVar5 + lVar10 + -0x10) = lVar12 + 1;
            *ssl_sessionid = *(void **)((long)pCVar5 + lVar10 + -0x20);
            if (idsize != (size_t *)0x0) {
              *idsize = *(size_t *)((long)pCVar5 + lVar10 + -0x18);
            }
            return false;
          }
        }
LAB_001283ec:
        uVar13 = uVar13 + 1;
        lVar10 = lVar10 + 0xa8;
        bVar14 = uVar13 < (data->set).general_ssl.max_ssl_sessions;
        bVar15 = !bVar14;
      } while (bVar14);
    }
  }
  return bVar15;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           void **ssl_sessionid,
                           size_t *idsize) /* set 0 if unknown */
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  *ssl_sessionid = NULL;
  if(!ssl_config)
    return TRUE;

  DEBUGASSERT(ssl_config->primary.sessionid);

  if(!ssl_config->primary.sessionid || !data->state.session)
    /* session ID reuse is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(connssl->peer.hostname, check->name) &&
       ((!cf->conn->bits.conn_to_host && !check->conn_to_host) ||
        (cf->conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(cf->conn->conn_to_host.name, check->conn_to_host))) &&
       ((!cf->conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (cf->conn->bits.conn_to_port && check->conn_to_port != -1 &&
         cf->conn->conn_to_port == check->conn_to_port)) &&
       (connssl->port == check->remote_port) &&
       strcasecompare(cf->conn->handler->scheme, check->scheme) &&
       match_ssl_primary_config(data, conn_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  DEBUGF(infof(data, "%s Session ID in cache for %s %s://%s:%d",
               no_match? "Didn't find": "Found",
               Curl_ssl_cf_is_proxy(cf) ? "proxy" : "host",
               cf->conn->handler->scheme, connssl->peer.hostname,
               connssl->port));
  return no_match;
}